

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<char> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  wchar_t total_size;
  Alignment AVar1;
  wchar_t value;
  int iVar2;
  Type_conflict TVar3;
  uint uVar4;
  CharPtr pcVar5;
  char *__last;
  CharPtr end;
  CharPtr p;
  CharPtr p_3;
  uint size;
  CharPtr p_2;
  CharPtr result;
  CharPtr p_1;
  undefined1 local_50 [4];
  uint fill_size;
  AlignSpec subspec;
  uint number_size;
  char fill;
  Alignment align;
  uint width;
  uint prefix_size_local;
  char *prefix_local;
  AlignSpec *spec_local;
  uint num_digits_local;
  BasicWriter<char> *this_local;
  
  total_size = WidthSpec::width(&spec->super_WidthSpec);
  AVar1 = AlignSpec::align(spec);
  value = WidthSpec::fill(&spec->super_WidthSpec);
  subspec.align_._3_1_ = internal::BasicCharTraits<char>::cast(value);
  iVar2 = AlignSpec::precision(spec);
  if ((int)num_digits < iVar2) {
    align = prefix_size;
    if ((prefix_size != 0) && (prefix[prefix_size - 1] == '0')) {
      align = prefix_size - ALIGN_LEFT;
    }
    iVar2 = AlignSpec::precision(spec);
    TVar3 = internal::to_unsigned<int>(iVar2);
    subspec.super_WidthSpec.fill_ = align + TVar3;
    AlignSpec::AlignSpec((AlignSpec *)local_50,subspec.super_WidthSpec.fill_,L'0',ALIGN_NUMERIC);
    if ((uint)subspec.super_WidthSpec.fill_ < (uint)total_size) {
      Buffer<char>::reserve(this->buffer_,(ulong)(uint)total_size);
      uVar4 = total_size - subspec.super_WidthSpec.fill_;
      if (AVar1 != ALIGN_LEFT) {
        pcVar5 = grow_buffer(this,(ulong)uVar4);
        std::uninitialized_fill<char*,char>
                  (pcVar5,pcVar5 + uVar4,(char *)((long)&subspec.align_ + 3));
      }
      this_local = (BasicWriter<char> *)
                   prepare_int_buffer<fmt::AlignSpec>
                             (this,num_digits,(AlignSpec *)local_50,prefix,align);
      if (AVar1 == ALIGN_LEFT) {
        pcVar5 = grow_buffer(this,(ulong)uVar4);
        std::uninitialized_fill<char*,char>
                  (pcVar5,pcVar5 + uVar4,(char *)((long)&subspec.align_ + 3));
      }
    }
    else {
      this_local = (BasicWriter<char> *)
                   prepare_int_buffer<fmt::AlignSpec>
                             (this,num_digits,(AlignSpec *)local_50,prefix,align);
    }
  }
  else {
    p_3._4_4_ = prefix_size + num_digits;
    if ((uint)p_3._4_4_ < (uint)total_size) {
      end = grow_buffer(this,(ulong)(uint)total_size);
      __last = end + (uint)total_size;
      if (AVar1 == ALIGN_LEFT) {
        std::uninitialized_copy<char_const*,char*>(prefix,prefix + prefix_size,end);
        std::uninitialized_fill<char*,char>
                  (end + (uint)p_3._4_4_,__last,(char *)((long)&subspec.align_ + 3));
        end = end + (uint)p_3._4_4_;
      }
      else if (AVar1 == ALIGN_CENTER) {
        pcVar5 = fill_padding(end,total_size,(ulong)(uint)p_3._4_4_,(int)(char)subspec.align_._3_1_)
        ;
        std::uninitialized_copy<char_const*,char*>(prefix,prefix + prefix_size,pcVar5);
        end = pcVar5 + (uint)p_3._4_4_;
      }
      else {
        if (AVar1 == ALIGN_NUMERIC) {
          if (prefix_size != 0) {
            end = std::uninitialized_copy<char_const*,char*>(prefix,prefix + prefix_size,end);
            p_3._4_4_ = p_3._4_4_ - prefix_size;
          }
        }
        else {
          std::uninitialized_copy<char_const*,char*>
                    (prefix,prefix + prefix_size,__last + -(ulong)(uint)p_3._4_4_);
        }
        std::uninitialized_fill<char*,char>
                  (end,__last + -(ulong)(uint)p_3._4_4_,(char *)((long)&subspec.align_ + 3));
        end = __last;
      }
      this_local = (BasicWriter<char> *)(end + -1);
    }
    else {
      pcVar5 = grow_buffer(this,(ulong)(uint)p_3._4_4_);
      std::uninitialized_copy<char_const*,char*>(prefix,prefix + prefix_size,pcVar5);
      this_local = (BasicWriter<char> *)(pcVar5 + ((ulong)(uint)p_3._4_4_ - 1));
    }
  }
  return (CharPtr)this_local;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}